

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent-socket.c
# Opt level: O2

Socket * platform_make_agent_socket(Plug *plug,char *dirprefix,char **error,char **name)

{
  uint uVar1;
  int iVar2;
  __pid_t _Var3;
  char *pcVar4;
  char *dirname;
  char *pcVar5;
  SockAddr *listenaddr;
  Socket *pSVar6;
  ssize_t sVar7;
  int cleanup_pipe [2];
  int buf [1024];
  
  *name = (char *)0x0;
  pcVar4 = get_username();
  dirname = dupprintf("%s.%s",dirprefix,pcVar4);
  safefree(pcVar4);
  if (*dirname != '/') {
    __assert_fail("*socketdir == \'/\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/agent-socket.c"
                  ,0x1c,"Socket *platform_make_agent_socket(Plug *, const char *, char **, char **)"
                 );
  }
  pcVar4 = make_dir_and_check_ours(dirname);
  if (pcVar4 == (char *)0x0) {
    uVar1 = getpid();
    pcVar4 = dupprintf("%s/pageant.%d",dirname,(ulong)uVar1);
    listenaddr = unix_sock_addr(pcVar4);
    pSVar6 = new_unix_listener(listenaddr,plug);
    pcVar5 = (*pSVar6->vt->socket_error)(pSVar6);
    if (pcVar5 != (char *)0x0) {
      pcVar5 = dupprintf("%s: %s\n",pcVar4,pcVar5);
      *error = pcVar5;
      (*pSVar6->vt->close)(pSVar6);
      safefree(pcVar4);
      rmdir(dirname);
      safefree(dirname);
      return (Socket *)0x0;
    }
    iVar2 = pipe(cleanup_pipe);
    if (iVar2 == 0) {
      _Var3 = fork();
      if (_Var3 == 0) {
        close(0);
        close(1);
        close(2);
        setpgid(0,0);
        close(cleanup_pipe[1]);
        do {
          sVar7 = read(cleanup_pipe[0],buf,0x1000);
        } while (0 < sVar7);
        unlink(pcVar4);
        rmdir(dirname);
        _exit(0);
      }
      close(cleanup_pipe[0]);
      if (_Var3 < 0) {
        close(cleanup_pipe[1]);
      }
      else {
        cloexec(cleanup_pipe[1]);
      }
    }
    *name = pcVar4;
    *error = (char *)0x0;
  }
  else {
    pSVar6 = (Socket *)0x0;
    pcVar5 = dupprintf("%s: %s\n",dirname,pcVar4);
    *error = pcVar5;
    safefree(pcVar4);
  }
  safefree(dirname);
  return pSVar6;
}

Assistant:

Socket *platform_make_agent_socket(
    Plug *plug, const char *dirprefix, char **error, char **name)
{
    char *username, *socketdir, *socketname, *errw;
    const char *err;
    Socket *sock;

    *name = NULL;

    username = get_username();
    socketdir = dupprintf("%s.%s", dirprefix, username);
    sfree(username);

    assert(*socketdir == '/');
    if ((errw = make_dir_and_check_ours(socketdir)) != NULL) {
        *error = dupprintf("%s: %s\n", socketdir, errw);
        sfree(errw);
        sfree(socketdir);
        return NULL;
    }

    socketname = dupprintf("%s/pageant.%d", socketdir, (int)getpid());
    sock = new_unix_listener(unix_sock_addr(socketname), plug);
    if ((err = sk_socket_error(sock)) != NULL) {
        *error = dupprintf("%s: %s\n", socketname, err);
        sk_close(sock);
        sfree(socketname);
        rmdir(socketdir);
        sfree(socketdir);
        return NULL;
    }

    /*
     * Spawn a subprocess which will try to reliably delete our socket
     * and its containing directory when we terminate, in case we die
     * unexpectedly.
     */
    {
        int cleanup_pipe[2];
        pid_t pid;

        /* Don't worry if pipe or fork fails; it's not _that_ critical. */
        if (!pipe(cleanup_pipe)) {
            if ((pid = fork()) == 0) {
                int buf[1024];
                /*
                 * Our parent process holds the writing end of
                 * this pipe, and writes nothing to it. Hence,
                 * we expect read() to return EOF as soon as
                 * that process terminates.
                 */

                close(0);
                close(1);
                close(2);

                setpgid(0, 0);
                close(cleanup_pipe[1]);
                while (read(cleanup_pipe[0], buf, sizeof(buf)) > 0);
                unlink(socketname);
                rmdir(socketdir);
                _exit(0);
            } else if (pid < 0) {
                close(cleanup_pipe[0]);
                close(cleanup_pipe[1]);
            } else {
                close(cleanup_pipe[0]);
                cloexec(cleanup_pipe[1]);
            }
        }
    }

    *name = socketname;
    *error = NULL;
    sfree(socketdir);
    return sock;
}